

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O0

int __thiscall CGL::SceneObjects::EnvironmentLight::init(EnvironmentLight *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  const_reference this_00;
  ostream *poVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  double dVar10;
  int i_3;
  double marginal_density;
  int j_3;
  int i_2;
  int j_2;
  int i_1;
  int j_1;
  int i;
  int j;
  double sum;
  uint32_t h;
  uint32_t w;
  double local_78;
  double local_70;
  double local_60;
  uint local_44;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  double local_18;
  
  uVar7 = (uint)this->envMap->w;
  uVar2 = (uint)this->envMap->h;
  auVar1 = ZEXT416(uVar7 * uVar2) * ZEXT816(8);
  uVar4 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->pdf_envmap = pdVar5;
  auVar1 = ZEXT416(uVar7 * uVar2) * ZEXT816(8);
  uVar4 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->conds_y = pdVar5;
  uVar4 = SUB168(ZEXT416(uVar2) * ZEXT816(8),0);
  if (SUB168(ZEXT416(uVar2) * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pdVar5 = (double *)operator_new__(uVar4);
  this->marginal_y = pdVar5;
  std::operator<<((ostream *)&std::cout,"[PathTracer] Initializing environment light...");
  local_18 = 0.0;
  for (local_1c = 0; local_1c < uVar2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < uVar7; local_20 = local_20 + 1) {
      this_00 = std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::operator[]
                          (&this->envMap->data,(ulong)(uVar7 * local_1c + local_20));
      fVar9 = Vector3D::illum(this_00);
      dVar10 = sin((((double)(int)local_1c + 0.5) * 3.141592653589793) / (double)uVar2);
      this->pdf_envmap[uVar7 * local_1c + local_20] = (double)fVar9 * dVar10;
      local_18 = this->pdf_envmap[uVar7 * local_1c + local_20] + local_18;
    }
  }
  for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < uVar7; local_28 = local_28 + 1) {
      uVar8 = uVar7 * local_24 + local_28;
      this->pdf_envmap[uVar8] = this->pdf_envmap[uVar8] / local_18;
    }
  }
  for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
    if (local_2c == 0) {
      local_60 = 0.0;
    }
    else {
      local_60 = this->marginal_y[(int)(local_2c - 1)];
    }
    this->marginal_y[(int)local_2c] = local_60;
    for (local_30 = 0; local_30 < uVar7; local_30 = local_30 + 1) {
      this->marginal_y[(int)local_2c] =
           this->pdf_envmap[uVar7 * local_2c + local_30] + this->marginal_y[(int)local_2c];
    }
  }
  for (local_34 = 0; local_34 < uVar2; local_34 = local_34 + 1) {
    dVar10 = this->marginal_y[(int)local_34];
    if (local_34 == 0) {
      local_70 = 0.0;
    }
    else {
      local_70 = this->marginal_y[(int)(local_34 - 1)];
    }
    for (local_44 = 0; local_44 < uVar7; local_44 = local_44 + 1) {
      if (local_44 == 0) {
        local_78 = 0.0;
      }
      else {
        local_78 = this->conds_y[(uVar7 * local_34 + local_44) - 1];
      }
      this->conds_y[uVar7 * local_34 + local_44] =
           local_78 + this->pdf_envmap[uVar7 * local_34 + local_44] / (dVar10 - local_70);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Saving out probability_debug image for debug.");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  save_probability_debug((EnvironmentLight *)CONCAT44(uVar7,uVar2));
  poVar6 = std::operator<<((ostream *)&std::cout,"done.");
  iVar3 = std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  return iVar3;
}

Assistant:

void EnvironmentLight::init() {
    uint32_t w = envMap->w, h = envMap->h;
    pdf_envmap = new double[w * h];
    conds_y = new double[w * h];
    marginal_y = new double[h];

    std::cout << "[PathTracer] Initializing environment light...";

    // 3-2 Part 3 Task 3 Steps 1,2,3
    // Store the environment map pdf to pdf_envmap
    // Store the marginal distribution for y to marginal_y
    // Store the conditional distribution for x given y to conds_y

    double sum = 0;
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] = envMap->data[w * j + i].illum() * sin(PI * (j + .5) / h);
        sum += pdf_envmap[w * j + i];
      }
    }

    // normalize so pdf_envmap sums to 1
    for (int j = 0; j < h; ++j) {
      for (int i = 0; i < w; ++i) {
        pdf_envmap[w * j + i] /= sum;
      }
    }

    // compute marginal distribution
    for (int j = 0; j < h; ++j) {
      marginal_y[j] = (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        marginal_y[j] += pdf_envmap[w * j + i];
      }
    }

    // compute conditional distributions
    for (int j = 0; j < h; ++j) {
      double marginal_density = marginal_y[j] - (j == 0 ? 0 : marginal_y[j-1]);
      for (int i = 0; i < w; ++i) {
        conds_y[w * j + i] = (i == 0 ? 0 : conds_y[w * j + i - 1]) + pdf_envmap[w * j + i] / marginal_density;
      }
    }

    if (true)
      std::cout << "Saving out probability_debug image for debug." << std::endl;
    save_probability_debug();

    std::cout << "done." << std::endl;
  }